

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

int __thiscall CTcTokenizer::read_line(CTcTokenizer *this,int append)

{
  int iVar1;
  int iVar2;
  newline_spacing_mode_t nVar3;
  CTcTokFileDesc *pCVar4;
  long lVar5;
  size_t sVar6;
  size_t sVar7;
  CTcSrcObject *pCVar8;
  char *pcVar9;
  undefined4 extraout_var;
  size_t sVar10;
  CTcTokStream *pCVar11;
  int in_ESI;
  CTcTokenizer *in_RDI;
  CTcTokStream *old_str;
  char *fname;
  size_t curlen;
  size_t start_len;
  size_t len;
  CTcTokenizer *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  CTcTokenizer *in_stack_ffffffffffffffc0;
  char *local_38;
  ulong local_20;
  int local_4;
  
  if (in_RDI->str_ == (CTcTokStream *)0x0) {
    local_4 = -1;
  }
  else {
    if (in_ESI == 0) {
      clear_linebuf(in_stack_ffffffffffffff80);
      pCVar4 = CTcTokStream::get_desc(in_RDI->str_);
      in_RDI->last_desc_ = pCVar4;
      lVar5 = CTcTokStream::get_next_linenum(in_RDI->str_);
      in_RDI->last_linenum_ = lVar5;
    }
    sVar6 = CTcTokString::get_text_len(&in_RDI->linebuf_);
    sVar7 = CTcTokString::get_text_len(&in_RDI->unsplicebuf_);
    local_4 = (int)sVar6;
    if (sVar7 == 0) {
      local_20 = sVar6;
      if (in_ESI != 0) {
        pCVar4 = CTcTokStream::get_desc(in_RDI->str_);
        in_RDI->appended_desc_ = pCVar4;
        lVar5 = CTcTokStream::get_next_linenum(in_RDI->str_);
        in_RDI->appended_linenum_ = lVar5;
      }
      while( true ) {
        while( true ) {
          while( true ) {
            pCVar8 = CTcTokStream::get_src(in_RDI->str_);
            pcVar9 = CTcTokString::get_buf(&in_RDI->linebuf_);
            sVar7 = CTcTokString::get_buf_size(&in_RDI->linebuf_);
            iVar1 = (*pCVar8->_vptr_CTcSrcObject[2])(pCVar8,pcVar9 + local_20,sVar7 - local_20);
            if (CONCAT44(extraout_var,iVar1) != 0) break;
            if (sVar6 < local_20) goto LAB_00293dbe;
            while( true ) {
              iVar1 = in_RDI->if_sp_;
              iVar2 = CTcTokStream::get_init_if_level(in_RDI->str_);
              if (iVar1 <= iVar2) break;
              local_38 = CTcTokFileDesc::get_fname(in_RDI->if_stack_[in_RDI->if_sp_ + -1].desc);
              if ((*(byte *)in_RDI >> 3 & 1) != 0) {
                local_38 = os_get_root_name((char *)in_stack_ffffffffffffff80);
              }
              lVar5 = in_RDI->if_stack_[in_RDI->if_sp_ + -1].linenum;
              sVar10 = strlen(local_38);
              log_error(0x273c,lVar5,sVar10 & 0xffffffff,local_38);
              pop_if(in_RDI);
            }
            in_stack_ffffffffffffff80 = (CTcTokenizer *)in_RDI->str_;
            pCVar11 = CTcTokStream::get_parent(in_RDI->str_);
            in_RDI->str_ = pCVar11;
            in_stack_ffffffffffffffc0 = in_stack_ffffffffffffff80;
            if (in_stack_ffffffffffffff80 != (CTcTokenizer *)0x0) {
              CTcTokStream::~CTcTokStream((CTcTokStream *)in_stack_ffffffffffffff80);
              operator_delete(in_stack_ffffffffffffff80,0x30);
            }
            if ((in_ESI == 0) && (in_RDI->str_ != (CTcTokStream *)0x0)) {
              pCVar4 = CTcTokStream::get_desc(in_RDI->str_);
              in_RDI->last_desc_ = pCVar4;
              lVar5 = CTcTokStream::get_next_linenum(in_RDI->str_);
              in_RDI->last_linenum_ = lVar5;
            }
            if (in_RDI->str_ == (CTcTokStream *)0x0) {
              return -1;
            }
            nVar3 = CTcTokStream::get_newline_spacing(in_RDI->str_);
            in_RDI->string_newline_spacing_ = nVar3;
          }
          local_20 = CONCAT44(extraout_var,iVar1) + -1 + local_20;
          CTcTokString::set_text_len(&in_RDI->linebuf_,local_20);
          if ((local_20 == 0) ||
             (pcVar9 = CTcTokString::get_text(&in_RDI->linebuf_), pcVar9[local_20 - 1] == '\n'))
          break;
          pCVar8 = CTcTokStream::get_src(in_RDI->str_);
          iVar1 = (*pCVar8->_vptr_CTcSrcObject[3])();
          if (iVar1 == 0) {
            CTcTokString::expand((CTcTokString *)0x293d17);
          }
        }
        if ((local_20 < 2) ||
           (pcVar9 = CTcTokString::get_text(&in_RDI->linebuf_), pcVar9[local_20 - 2] != '\\'))
        break;
        local_20 = local_20 - 2;
        CTcTokString::set_text_len(&in_RDI->linebuf_,local_20);
        CTcTokStream::count_line(in_RDI->str_);
      }
      if (local_20 != 0) {
        CTcTokString::set_text_len(&in_RDI->linebuf_,local_20 - 1);
      }
      CTcTokStream::count_line(in_RDI->str_);
LAB_00293dbe:
      process_comments(in_stack_ffffffffffffffc0,(size_t)in_RDI);
      return local_4;
    }
    CTcTokString::get_text(&in_RDI->unsplicebuf_);
    CTcTokString::get_text_len(&in_RDI->unsplicebuf_);
    CTcTokString::append
              ((CTcTokString *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff88,(size_t)in_stack_ffffffffffffff80);
    CTcTokString::clear_text(&in_RDI->unsplicebuf_);
    in_RDI->last_desc_ = in_RDI->appended_desc_;
    in_RDI->last_linenum_ = in_RDI->appended_linenum_;
  }
  return local_4;
}

Assistant:

int CTcTokenizer::read_line(int append)
{
    /* if there's no input stream, indicate end-of-file */
    if (str_ == 0)
        return -1;

    /* if we're not appending, clear out the line buffer */
    if (!append)
    {
        /* start with an empty line */
        clear_linebuf();

        /* note the current input position */
        last_desc_ = str_->get_desc();
        last_linenum_ = str_->get_next_linenum();
    }

    /* note where the new data starts */
    size_t len = linebuf_.get_text_len();
    size_t start_len = len;

    /* 
     *   if there's anything in the unsplice buffer, use it as the new
     *   line 
     */
    if (unsplicebuf_.get_text_len() != 0)
    {
        /* 
         *   Copy the unsplice buffer as the current line.  Note that we
         *   don't have to worry about any of the complicated cases, such
         *   as whether or not it ends with a newline or a backslash,
         *   because the unspliced line was already processed as an input
         *   line when we read it in the first place. 
         */
        linebuf_.append(unsplicebuf_.get_text(), unsplicebuf_.get_text_len());
        
        /* clear the unsplice buffer, since it's been consumed now */
        unsplicebuf_.clear_text();

        /* 
         *   make the current line the appended line - if we're
         *   unsplicing, it means that we appended, so the current line is
         *   now the line from which the last appended text came 
         */
        last_desc_ = appended_desc_;
        last_linenum_ = appended_linenum_;

        /* return the offset of the new text */
        return start_len;
    }

    /* if we're appending, note where the appendage is coming from */
    if (append)
    {
        /* remember the last source line appended */
        appended_desc_ = str_->get_desc();
        appended_linenum_ = str_->get_next_linenum();
    }

    /* keep going until we finish reading the input line */
    for ( ;; )
    {
        /* read a line of text from the input file */
        size_t curlen = str_->get_src()->read_line(
            linebuf_.get_buf() + len, linebuf_.get_buf_size() - len);

        /* check for end of file */
        if (curlen == 0)
        {
            /*
             *   We've reached the end of the current input stream.  If
             *   we've already read anything into the current line, it
             *   means that the file ended in mid-line, without a final
             *   newline character; ignore this and proceed with the line
             *   as it now stands in this case.  
             */
            if (len > start_len)
                break;

            /* 
             *   We've finished with this stream.  If there's a parent
             *   stream, return to it; otherwise, we're at the end of the
             *   source.  
             */

            /* 
             *   if we didn't close all of the #if/#ifdef levels opened
             *   within this file, flag one or more errors 
             */
            while (if_sp_ > str_->get_init_if_level())
            {
                /* get the filename from the #if stack */
                const char *fname = if_stack_[if_sp_ - 1].desc->get_fname();

                /* if we're in test reporting mode, use the root name only */
                if (test_report_mode_)
                    fname = os_get_root_name((char *)fname);

                /* log the error */
                log_error(TCERR_IF_WITHOUT_ENDIF,
                          if_stack_[if_sp_ - 1].linenum,
                          (int)strlen(fname), fname);

                /* discard the #if level */
                pop_if();
            }

            /* remember the old stream */
            CTcTokStream *old_str = str_;

            /* return to the parent stream, if there is one */
            str_ = str_->get_parent();

            /* delete the old stream now that we're done with it */
            delete old_str;

            /* note the new file the line will be coming from */
            if (!append && str_ != 0)
            {
                last_desc_ = str_->get_desc();
                last_linenum_ = str_->get_next_linenum();
            }

            /* if there's no stream, return end of file */
            if (str_ == 0)
                return -1;

            /* 
             *   restore the #pragma newline_spacing mode that was in effect
             *   when we interrupted the parent stream 
             */
            string_newline_spacing_ = str_->get_newline_spacing();

            /* if there's a parser, notify it of the new pragma C mode */
#if 0 // #pragma C is not currently used
            if (G_prs != 0)
                G_prs->set_pragma_c(str_->is_pragma_c());
#endif

            /* go back to read the next line from the parent */
            continue;
        }

        /* set the new length of the buffer contents */
        len += curlen - 1;
        linebuf_.set_text_len(len);

        /*
         *   Check the result to see if it ends in a newline.  If not, it
         *   means either that we don't have room in the buffer for the
         *   full source line, or we've reached the last line in the file,
         *   and it doesn't end with a newline.
         *   
         *   Note that the file reader will always supply us with '\n'
         *   newlines, regardless of the local operating system
         *   conventions.
         *   
         *   Also, check to see if the line ends with '\\'.  If so, remove
         *   the '\\' character and read the next line, since this
         *   indicates that the logical line continues onto the next
         *   newline-deliminted line.  
         */
        if (len != 0 && linebuf_.get_text()[len - 1] != '\n')
        {
            /* 
             *   There's no newline, hence the file reader wasn't able to
             *   fit the entire line into our buffer, or else we've read
             *   the last line in the file and there's no newline at the
             *   end.  If we haven't reached the end of the file, expand
             *   our line buffer to make room to read more from this same
             *   line.  
             */
            if (!str_->get_src()->at_eof())
                linebuf_.expand();
        }
        else if (len > 1 && linebuf_.get_text()[len - 2] == '\\')
        {
            /* 
             *   There's a backslash at the end of the line, so they want
             *   to continue this logical line.  Remove the backslash, and
             *   read the next line onto the end of the current line.
             *   
             *   Note that we must remove two characters from the end of
             *   the line (and tested for buf_[len-2] above) because we
             *   have both a backslash and a newline at the end of the
             *   line.  
             */
            len -= 2;
            linebuf_.set_text_len(len);

            /* count reading the physical line */
            str_->count_line();
        }
        else
        {
            /* remove the newline from the buffer */
            if (len != 0)
            {
                --len;
                linebuf_.set_text_len(len);
            }
            
            /* count reading the line */
            str_->count_line();

            /* done */
            break;
        }
    }

    /* 
     *   remove comments from the newly-read material - this replaces each
     *   comment by a single whitespace character 
     */
    process_comments(start_len);

    /* 
     *   we've successfully read a line -- return the offset of the start of
     *   the newly-read text 
     */
    return start_len;
}